

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrInstanceCreateInfo *value)

{
  NextChainResult NVar1;
  XrResult XVar2;
  uint uVar3;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  ulong uVar4;
  uint32_t in_stack_fffffffffffffd0c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabled_extension_vec;
  allocator local_2b9;
  string local_2b8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_238;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_220;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  string error_message;
  
  XVar2 = XR_SUCCESS;
  if (value->type != XR_TYPE_INSTANCE_CREATE_INFO) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrInstanceCreateInfo",value->type,
               "VUID-XrInstanceCreateInfo-type-type",XR_TYPE_INSTANCE_CREATE_INFO,
               "XR_TYPE_INSTANCE_CREATE_INFO");
  }
  if (!check_pnext) goto LAB_00139f9f;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  error_message._M_dataplus._M_p._0_4_ = 0x3b9b143a;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9ae940;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  NVar1 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&enabled_extension_vec);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_
              ((string *)&enabled_extension_vec,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&enabled_extension_vec);
    std::__cxx11::string::string
              ((string *)&enabled_extension_vec,"VUID-XrInstanceCreateInfo-next-unique",
               (allocator *)&stack0xfffffffffffffd0f);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1d8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2b8,
               "Multiple structures of the same type(s) in \"next\" chain for XrInstanceCreateInfo struct"
               ,&local_2b9);
    CoreValidLogMessage(instance_info,(string *)&enabled_extension_vec,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1d8,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1d8);
    std::__cxx11::string::~string((string *)&enabled_extension_vec);
LAB_00139f6a:
    std::__cxx11::string::~string((string *)&error_message);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrInstanceCreateInfo-next-next",
               (allocator *)&local_2b8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c0,objects_info);
    std::__cxx11::string::string
              ((string *)&enabled_extension_vec,
               "Invalid structure(s) in \"next\" chain for XrInstanceCreateInfo struct \"next\"",
               (allocator *)&stack0xfffffffffffffd0f);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c0,(string *)&enabled_extension_vec);
    std::__cxx11::string::~string((string *)&enabled_extension_vec);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1c0);
    goto LAB_00139f6a;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_00139f9f:
  if (check_members && XVar2 == XR_SUCCESS) {
    if (value->createFlags == 0) {
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,true,false,
                               &value->applicationInfo);
      if (XVar2 == XR_SUCCESS) {
        if ((value->enabledApiLayerCount == 0) || (value->enabledApiLayerNames != (char **)0x0)) {
          uVar3 = value->enabledExtensionCount;
          if ((uVar3 == 0) || (value->enabledExtensionNames != (char **)0x0)) {
            enabled_extension_vec.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            enabled_extension_vec.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            enabled_extension_vec.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
              std::__cxx11::string::string
                        ((string *)&error_message,value->enabledExtensionNames[uVar4],
                         (allocator *)&local_2b8);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &enabled_extension_vec,&error_message);
              std::__cxx11::string::~string((string *)&error_message);
              uVar3 = value->enabledExtensionCount;
            }
            std::__cxx11::string::string
                      ((string *)&error_message,"XrInstanceCreateInfo",(allocator *)&local_2b8);
            std::__cxx11::string::~string((string *)&error_message);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&enabled_extension_vec);
            return XR_SUCCESS;
          }
          std::__cxx11::string::string
                    ((string *)&error_message,
                     "VUID-XrInstanceCreateInfo-enabledExtensionNames-parameter",
                     (allocator *)&local_2b8);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_238,objects_info);
          std::__cxx11::string::string
                    ((string *)&enabled_extension_vec,
                     "Structure XrInstanceCreateInfo member enabledExtensionCount is NULL, but value->enabledExtensionCount is greater than 0"
                     ,(allocator *)&valid_ext_structs);
          CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_238,(string *)&enabled_extension_vec);
          std::__cxx11::string::~string((string *)&enabled_extension_vec);
          this = &local_238;
        }
        else {
          std::__cxx11::string::string
                    ((string *)&error_message,
                     "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter",
                     (allocator *)&local_2b8);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_220,objects_info);
          std::__cxx11::string::string
                    ((string *)&enabled_extension_vec,
                     "Structure XrInstanceCreateInfo member enabledApiLayerCount is NULL, but value->enabledApiLayerCount is greater than 0"
                     ,(allocator *)&valid_ext_structs);
          CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_220,(string *)&enabled_extension_vec);
          std::__cxx11::string::~string((string *)&enabled_extension_vec);
          this = &local_220;
        }
      }
      else {
        std::__cxx11::string::string
                  ((string *)&error_message,"VUID-XrInstanceCreateInfo-applicationInfo-parameter",
                   (allocator *)&local_2b8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_208,objects_info);
        std::__cxx11::string::string
                  ((string *)&enabled_extension_vec,
                   "Structure XrInstanceCreateInfo member applicationInfo is invalid",
                   (allocator *)&valid_ext_structs);
        CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_208,(string *)&enabled_extension_vec);
        std::__cxx11::string::~string((string *)&enabled_extension_vec);
        this = &local_208;
      }
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(this);
      std::__cxx11::string::~string((string *)&error_message);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "XrInstanceCreateInfo invalid member XrInstanceCreateFlags \"createFlags\" flag value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd0c);
      std::operator<<((ostream *)&error_message,(string *)&enabled_extension_vec);
      std::__cxx11::string::~string((string *)&enabled_extension_vec);
      std::operator<<((ostream *)&error_message," contains illegal bit");
      std::__cxx11::string::string
                ((string *)&enabled_extension_vec,"VUID-XrInstanceCreateInfo-createFlags-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1f0,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,(string *)&enabled_extension_vec,
                          VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1f0,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1f0);
      std::__cxx11::string::~string((string *)&enabled_extension_vec);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    }
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar2;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrInstanceCreateInfo* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_INSTANCE_CREATE_INFO) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrInstanceCreateInfo",
                             value->type, "VUID-XrInstanceCreateInfo-type-type", XR_TYPE_INSTANCE_CREATE_INFO, "XR_TYPE_INSTANCE_CREATE_INFO");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT);
        valid_ext_structs.push_back(XR_TYPE_INSTANCE_CREATE_INFO_ANDROID_KHR);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrInstanceCreateInfo struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrInstanceCreateInfo : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrInstanceCreateInfo struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult instance_create_flags_result = ValidateXrInstanceCreateFlags(value->createFlags);
    // Valid flags available, so it must be invalid to fail.
    if (VALIDATE_XR_FLAGS_INVALID == instance_create_flags_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrInstanceCreateInfo invalid member XrInstanceCreateFlags \"createFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->createFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-createFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate that the structure XrApplicationInfo is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, &value->applicationInfo);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-applicationInfo-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrInstanceCreateInfo member applicationInfo is invalid");
        return xr_result;
    }
    // Optional array must be non-NULL when value->enabledApiLayerCount is non-zero
    if (0 != value->enabledApiLayerCount && nullptr == value->enabledApiLayerNames) {
        CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrInstanceCreateInfo member enabledApiLayerCount is NULL, but value->enabledApiLayerCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->enabledApiLayerNames && 0 != value->enabledApiLayerCount) {
        CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrInstanceCreateInfo contains invalid NULL for char \"enabledApiLayerNames\" is which not "
                            "optional since \"enabledApiLayerCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter" null-termination
    // Optional array must be non-NULL when value->enabledExtensionCount is non-zero
    if (0 != value->enabledExtensionCount && nullptr == value->enabledExtensionNames) {
        CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-enabledExtensionNames-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrInstanceCreateInfo member enabledExtensionCount is NULL, but value->enabledExtensionCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->enabledExtensionNames && 0 != value->enabledExtensionCount) {
        CoreValidLogMessage(instance_info, "VUID-XrInstanceCreateInfo-enabledExtensionNames-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrInstanceCreateInfo contains invalid NULL for char \"enabledExtensionNames\" is which not "
                            "optional since \"enabledExtensionCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrInstanceCreateInfo-enabledExtensionNames-parameter" null-termination
    std::vector<std::string> enabled_extension_vec;
    for (uint32_t extension = 0; extension < value->enabledExtensionCount; ++extension) {
        enabled_extension_vec.push_back(value->enabledExtensionNames[extension]);
    }
    if (!ValidateInstanceExtensionDependencies(nullptr, command_name, "XrInstanceCreateInfo",
                                               objects_info, enabled_extension_vec)) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}